

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(SizeStatistics *a,SizeStatistics *b)

{
  _SizeStatistics__isset _Var1;
  int64_t iVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  pointer plVar6;
  
  iVar2 = a->unencoded_byte_array_data_bytes;
  a->unencoded_byte_array_data_bytes = b->unencoded_byte_array_data_bytes;
  b->unencoded_byte_array_data_bytes = iVar2;
  plVar3 = (a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  plVar5 = (a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar6 = (a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::_M_move_assign
            (&(a->repetition_level_histogram).super_vector<long,_std::allocator<long>_>,
             &b->repetition_level_histogram);
  plVar4 = (b->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (b->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = plVar5;
  (b->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish = plVar6
  ;
  (b->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = plVar3;
  if (plVar4 != (pointer)0x0) {
    operator_delete(plVar4);
  }
  plVar3 = (a->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  plVar5 = (a->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar6 = (a->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (a->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (a->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (a->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::_M_move_assign
            (&(a->definition_level_histogram).super_vector<long,_std::allocator<long>_>,
             &b->definition_level_histogram);
  plVar4 = (b->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (b->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = plVar5;
  (b->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish = plVar6
  ;
  (b->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = plVar3;
  if (plVar4 != (pointer)0x0) {
    operator_delete(plVar4);
  }
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(SizeStatistics &a, SizeStatistics &b) {
  using ::std::swap;
  swap(a.unencoded_byte_array_data_bytes, b.unencoded_byte_array_data_bytes);
  swap(a.repetition_level_histogram, b.repetition_level_histogram);
  swap(a.definition_level_histogram, b.definition_level_histogram);
  swap(a.__isset, b.__isset);
}